

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O0

pcp_flow_t * pcp_create_flow(pcp_server_t *s,flow_key_data *fkd)

{
  pcp_server_t *ppVar1;
  uint32_t local_2c;
  pcp_flow_t *flow;
  flow_key_data *fkd_local;
  pcp_server_t *s_local;
  
  if ((fkd != (flow_key_data *)0x0) && (s != (pcp_server_t *)0x0)) {
    s_local = (pcp_server_t *)calloc(1,0x368);
    if (s_local == (pcp_server_t *)0x0) {
      pcp_logger(PCP_LOGLVL_ERR,"%s","Malloc can\'t allocate enough memory for the pcp_flow.");
      pcp_logger(PCP_LOGLVL_ERR,"%s","Returning NULL.");
      s_local = (pcp_server_t *)0x0;
    }
    else {
      ppVar1 = s_local + 2;
      (ppVar1->pcp_server_saddr).__ss_padding[0x56] = '\0';
      (ppVar1->pcp_server_saddr).__ss_padding[0x57] = '\0';
      (ppVar1->pcp_server_saddr).__ss_padding[0x58] = '\0';
      (ppVar1->pcp_server_saddr).__ss_padding[0x59] = '\0';
      if (s == (pcp_server_t *)0x0) {
        local_2c = 0xffffffff;
      }
      else {
        local_2c = s->index;
      }
      *(uint32_t *)((s_local->pcp_server_saddr).__ss_padding + 0x36) = local_2c;
      memcpy(s_local->pcp_ip,fkd,0x4c);
      s_local->pcp_server_paddr[0x24] = -1;
      s_local->pcp_server_paddr[0x25] = -1;
      s_local->pcp_server_paddr[0x26] = -1;
      s_local->pcp_server_paddr[0x27] = -1;
      s_local->ctx = s->ctx;
    }
    return (pcp_flow_t *)s_local;
  }
  __assert_fail("fkd && s",
                "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_client_db.c"
                ,0x45,"pcp_flow_t *pcp_create_flow(pcp_server_t *, struct flow_key_data *)");
}

Assistant:

pcp_flow_t *pcp_create_flow(pcp_server_t *s, struct flow_key_data *fkd) {
    pcp_flow_t *flow;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    assert(fkd && s);

    flow = (pcp_flow_t *)calloc(1, sizeof(struct pcp_flow_s));
    if (flow == NULL) {
        PCP_LOG(PCP_LOGLVL_ERR, "%s",
                "Malloc can't allocate enough memory for the pcp_flow.");
        PCP_LOG(PCP_LOGLVL_ERR, "%s", "Returning NULL.");
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return NULL;
    }

    flow->pcp_msg_len = 0;
    flow->pcp_server_indx = (s ? s->index : PCP_INV_SERVER);
    flow->kd = *fkd;
    flow->key_bucket = EMPTY;
    flow->ctx = s->ctx;

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return flow;
}